

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O0

Clause * __thiscall Lib::Deque<Kernel::Clause_*>::pop_back(Deque<Kernel::Clause_*> *this)

{
  Clause *res;
  Deque<Kernel::Clause_*> *this_local;
  
  if (this->_back == this->_data) {
    this->_back = this->_end;
  }
  this->_back = this->_back + -1;
  return *this->_back;
}

Assistant:

inline
  C pop_back()
  {
    ASS(isNonEmpty());

    if(_back==_data) {
      _back=_end;
    }
    _back--;

    C res=*_back;
    _back->~C();

    return res;
  }